

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

UnicodeString *
icu_63::TimeZone::getWindowsID(UnicodeString *id,UnicodeString *winid,UErrorCode *status)

{
  ushort uVar1;
  UChar *pUVar2;
  UBool UVar3;
  int8_t iVar4;
  ushort uVar5;
  UResType UVar6;
  UResourceBundle *resB;
  UResourceBundle *fillIn;
  UResourceBundle *fillIn_00;
  UChar *pUVar7;
  char *src;
  UChar *pUVar8;
  undefined4 length;
  undefined8 uVar9;
  UBool isSystemID;
  int32_t len;
  UnicodeString canonicalID;
  UBool local_ed;
  uint local_ec;
  UChar *local_e8;
  UErrorCode local_e0;
  int local_dc;
  UChar *local_d8;
  UChar *local_d0;
  undefined8 local_c8;
  UChar *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  uVar1 = (winid->fUnion).fStackFields.fLengthAndFlags;
  uVar5 = 2;
  if ((uVar1 & 1) == 0) {
    uVar5 = uVar1 & 0x1e;
  }
  (winid->fUnion).fStackFields.fLengthAndFlags = uVar5;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f7be0;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_ed = '\0';
    getCanonicalID(id,&local_b0,&local_ed,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (local_ed != '\0')) {
      resB = ures_openDirect_63((char *)0x0,"windowsZones",status);
      pUVar8 = (UChar *)status;
      ures_getByKey_63(resB,"mapTimezones",resB,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        fillIn = (UResourceBundle *)0x0;
        uVar9 = 0;
        while (((UVar3 = ures_hasNext_63(resB), UVar3 != '\0' && ((char)uVar9 == '\0')) &&
               (fillIn = ures_getNextResource_63(resB,fillIn,status),
               *status < U_ILLEGAL_ARGUMENT_ERROR))) {
          UVar6 = ures_getType_63(fillIn);
          if (UVar6 == RES_TABLE) {
            fillIn_00 = (UResourceBundle *)0x0;
            do {
              do {
                UVar3 = ures_hasNext_63(fillIn);
                if (((UVar3 == '\0') || ((char)uVar9 != '\0')) ||
                   (fillIn_00 = ures_getNextResource_63(fillIn,fillIn_00,status),
                   U_ZERO_ERROR < *status)) goto LAB_00204acc;
                UVar6 = ures_getType_63(fillIn_00);
              } while (UVar6 != RES_STRING);
              local_d8 = ures_getString_63(fillIn_00,&local_dc,status);
              local_e0 = *status;
              if (local_e0 < U_ILLEGAL_ARGUMENT_ERROR) {
                local_ec = 0;
                local_e8 = local_d8;
                while ((local_ec & 1) == 0) {
                  local_c8 = uVar9;
                  pUVar7 = u_strchr_63(local_e8,L' ');
                  pUVar2 = local_e8;
                  local_ec = (uint)CONCAT71((int7)((ulong)pUVar8 >> 8),pUVar7 == (UChar *)0x0);
                  local_d0 = local_d8 + local_dc;
                  if (pUVar7 != (UChar *)0x0) {
                    local_d0 = pUVar7;
                  }
                  length = local_b0.fUnion.fFields.fLength;
                  if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
                    length = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  pUVar8 = local_e8;
                  iVar4 = UnicodeString::doCompare
                                    (&local_b0,0,length,local_e8,0,
                                     (int32_t)((ulong)((long)local_d0 - (long)local_e8) >> 1));
                  local_c0 = pUVar2;
                  if (iVar4 == '\0') {
                    src = ures_getKey_63(fillIn);
                    pUVar8 = (UChar *)0x0;
                    UnicodeString::UnicodeString(&local_70,src,-1,kInvariant);
                    UnicodeString::moveFrom(winid,&local_70);
                    UnicodeString::~UnicodeString(&local_70);
                    uVar9 = CONCAT71((int7)((ulong)&local_70 >> 8),1);
                    break;
                  }
                  local_e8 = local_d0 + 1;
                  uVar9 = local_c8;
                }
              }
            } while (local_e0 < U_ILLEGAL_ARGUMENT_ERROR);
LAB_00204acc:
            ures_close_63(fillIn_00);
          }
        }
        ures_close_63(fillIn);
        ures_close_63(resB);
      }
    }
    else if (*status == U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_ZERO_ERROR;
    }
    UnicodeString::~UnicodeString(&local_b0);
  }
  return winid;
}

Assistant:

UnicodeString&
TimeZone::getWindowsID(const UnicodeString& id, UnicodeString& winid, UErrorCode& status) {
    winid.remove();
    if (U_FAILURE(status)) {
        return winid;
    }

    // canonicalize the input ID
    UnicodeString canonicalID;
    UBool isSystemID = FALSE;

    getCanonicalID(id, canonicalID, isSystemID, status);
    if (U_FAILURE(status) || !isSystemID) {
        // mapping data is only applicable to tz database IDs
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            // getWindowsID() sets an empty string where
            // getCanonicalID() sets a U_ILLEGAL_ARGUMENT_ERROR.
            status = U_ZERO_ERROR;
        }
        return winid;
    }

    UResourceBundle *mapTimezones = ures_openDirect(NULL, "windowsZones", &status);
    ures_getByKey(mapTimezones, "mapTimezones", mapTimezones, &status);

    if (U_FAILURE(status)) {
        return winid;
    }

    UResourceBundle *winzone = NULL;
    UBool found = FALSE;
    while (ures_hasNext(mapTimezones) && !found) {
        winzone = ures_getNextResource(mapTimezones, winzone, &status);
        if (U_FAILURE(status)) {
            break;
        }
        if (ures_getType(winzone) != URES_TABLE) {
            continue;
        }
        UResourceBundle *regionalData = NULL;
        while (ures_hasNext(winzone) && !found) {
            regionalData = ures_getNextResource(winzone, regionalData, &status);
            if (U_FAILURE(status)) {
                break;
            }
            if (ures_getType(regionalData) != URES_STRING) {
                continue;
            }
            int32_t len;
            const UChar *tzids = ures_getString(regionalData, &len, &status);
            if (U_FAILURE(status)) {
                break;
            }

            const UChar *start = tzids;
            UBool hasNext = TRUE;
            while (hasNext) {
                const UChar *end = u_strchr(start, (UChar)0x20);
                if (end == NULL) {
                    end = tzids + len;
                    hasNext = FALSE;
                }
                if (canonicalID.compare(start, static_cast<int32_t>(end - start)) == 0) {
                    winid = UnicodeString(ures_getKey(winzone), -1 , US_INV);
                    found = TRUE;
                    break;
                }
                start = end + 1;
            }
        }
        ures_close(regionalData);
    }
    ures_close(winzone);
    ures_close(mapTimezones);

    return winid;
}